

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ler.c
# Opt level: O1

int errfmt(char *outbuf,int outbufl,char *fmt,int argc,erradef *argv)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  size_t sVar4;
  int iVar5;
  char *__format;
  int iVar6;
  int iVar7;
  char buf [20];
  char *local_68;
  char *local_50;
  char local_48 [24];
  
  cVar3 = *fmt;
  iVar7 = 0;
  local_68 = outbuf;
  if (1 < outbufl && cVar3 != '\0') {
    iVar6 = 0;
    iVar7 = 0;
    do {
      if (cVar3 == '%') {
        pcVar1 = fmt + 1;
        cVar3 = fmt[1];
        if (argc <= iVar6) {
          cVar3 = '\x01';
        }
        if (cVar3 < 'd') {
          if (cVar3 == '\0') {
            iVar5 = 0;
          }
          else if (cVar3 == '%') {
            iVar5 = 1;
            local_50 = "%";
            fmt = pcVar1;
          }
          else {
LAB_0012bea0:
            iVar6 = iVar6 + -1;
            iVar5 = 0;
            local_50 = "";
            fmt = pcVar1;
          }
        }
        else {
          if (cVar3 == 'd') {
            uVar2 = argv[iVar6].erraint;
            __format = "%d";
          }
          else {
            if (cVar3 == 's') {
              local_50 = argv[iVar6].errastr;
              sVar4 = strlen(local_50);
              iVar5 = (int)sVar4;
              fmt = pcVar1;
              goto LAB_0012beac;
            }
            if (cVar3 != 'u') goto LAB_0012bea0;
            uVar2 = argv[iVar6].erraint;
            __format = "%u";
          }
          local_50 = local_48;
          sprintf(local_48,__format,(ulong)uVar2);
          sVar4 = strlen(local_50);
          iVar5 = (int)sVar4;
          fmt = pcVar1;
        }
LAB_0012beac:
        iVar6 = iVar6 + 1;
      }
      else {
        fmt = fmt;
        if (cVar3 == '\\') {
          cVar3 = fmt[1];
          if (cVar3 == '\0') {
            iVar5 = 1;
          }
          else {
            fmt = fmt + 1;
            if (cVar3 == '\t') {
              iVar5 = 1;
              local_50 = "\t";
            }
            else {
              if (cVar3 != '\n') goto LAB_0012bda7;
              iVar5 = 1;
              local_50 = "\n";
            }
          }
        }
        else {
LAB_0012bda7:
          local_50 = fmt;
          iVar5 = 1;
          fmt = local_50;
        }
      }
      if (iVar5 != 0) {
        if (outbufl < iVar5) {
          memcpy(local_68,local_50,(ulong)(uint)outbufl - 1);
          outbufl = 1;
        }
        else {
          memcpy(local_68,local_50,(long)iVar5);
          local_68 = local_68 + iVar5;
          outbufl = outbufl - iVar5;
        }
        iVar7 = iVar7 + iVar5;
      }
      cVar3 = fmt[1];
    } while ((cVar3 != '\0') && (fmt = fmt + 1, 1 < outbufl));
  }
  if (outbufl != 0) {
    *local_68 = '\0';
  }
  return iVar7;
}

Assistant:

int errfmt(char *outbuf, int outbufl, char *fmt, int argc, erradef *argv)
{
    int    outlen = 0;
    int    argi   = 0;
    int    len;
    char   buf[20];
    char  *p;
    char   fmtchar;

    while (*fmt != '\0' && outbufl > 1)
    {
        switch(*fmt)
        {
        case '\\':
            ++fmt;
            len = 1;
            switch(*fmt)
            {
            case '\0':
                --fmt;
                break;
            case '\n':
                p = "\n";
                break;
            case '\t':
                p = "\t";
                break;
            default:
                p = fmt;
                break;
            }
            break;
            
        case '%':
            ++fmt;
            fmtchar = *fmt;
            if (argi >= argc) fmtchar = 1;          /* too many - ignore it */
            switch(fmtchar)
            {
            case '\0':
                --fmt;
                len = 0;
                break;
                
            case '%':
                p = "%";
                len = 1;
                break;
                
            case 'd':
                sprintf(buf, "%d", argv[argi].erraint);
                len = strlen(buf);
                p = buf;
                break;
                
            case 'u':
                sprintf(buf, "%u", argv[argi].erraint);
                len = strlen(buf);
                p = buf;
                break;
                
            case 's':
                p = argv[argi].errastr;
                len = strlen(p);
                break;
                
            default:
                p = "";
                len = 0;
                --argi;
                break;
            }
            ++argi;
            break;
            
        default:
            p = fmt;
            len = 1;
            break;
        }

        /* copy output that was set up above */
        if (len != 0)
        {
            if (outbufl >= len)
            {
                memcpy(outbuf, p, (size_t)len);
                outbufl -= len;
                outbuf += len;
            }
            else if (outbufl > 1)
            {
                memcpy(outbuf, p, (size_t)outbufl - 1);
                outbufl = 1;
            }
            outlen += len;
        }
        ++fmt;
    }

    /* add a null terminator */
    if (outbufl != 0)
        *outbuf++ = '\0';

    /* return the length */
    return outlen;
}